

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O1

void __thiscall autoSimplification_numerical_Test::TestBody(autoSimplification_numerical_Test *this)

{
  ExprPtr *ex;
  char *message;
  double __x;
  double in_XMM1_Qa;
  AssertionResult gtest_ar;
  ExprPtr n2;
  ExprPtr e;
  ExprPtr n3;
  AssertHelper local_80;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  string local_58;
  impl local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  local_60->_M_use_count = 1;
  local_60->_M_weak_count = 1;
  local_60->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_68 = local_60 + 1;
  *(undefined4 *)&local_60[1]._vptr__Sp_counted_base = 2;
  *(undefined1 *)&local_60[4]._M_use_count = 0;
  local_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  local_20->_M_use_count = 1;
  local_20->_M_weak_count = 1;
  local_20->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_28 = local_20 + 1;
  *(undefined4 *)&local_20[1]._vptr__Sp_counted_base = 3;
  *(undefined1 *)&local_20[4]._M_use_count = 0;
  mathiu::impl::pow(local_38,__x,in_XMM1_Qa);
  mathiu::impl::toString_abi_cxx11_(&local_58,local_38,ex);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            (local_78,"toString(e)","\"8\"",&local_58,(char (*) [2])0x20511e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x256,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  return;
}

Assistant:

TEST(autoSimplification, numerical)
{
    auto const n2 = 2_i;
    auto const n3 = 3_i;
    auto const e = n2 ^ n3;
    EXPECT_EQ(toString(e), "8");
}